

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::SchemaLoader(SchemaLoader *this,LazyLoadCallback *callback)

{
  Own<capnp::SchemaLoader::Impl,_std::nullptr_t> local_28;
  LazyLoadCallback *local_18;
  LazyLoadCallback *callback_local;
  SchemaLoader *this_local;
  
  local_18 = callback;
  callback_local = (LazyLoadCallback *)this;
  kj::
  heap<capnp::SchemaLoader::Impl,capnp::SchemaLoader&,capnp::SchemaLoader::LazyLoadCallback_const&>
            ((kj *)&local_28,this,callback);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,decltype(nullptr)>>::
  MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,decltype(nullptr)>>
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,decltype(nullptr)>> *)this,&local_28);
  kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>::~Own(&local_28);
  return;
}

Assistant:

SchemaLoader::SchemaLoader(const LazyLoadCallback& callback)
    : impl(kj::heap<Impl>(*this, callback)) {}